

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O3

monst * revive(obj *obj)

{
  char cVar1;
  short sVar2;
  bool bVar3;
  boolean bVar4;
  byte bVar5;
  int iVar6;
  monst *pmVar7;
  char *pcVar8;
  monst *pmVar9;
  char cVar10;
  schar sVar11;
  uint uVar12;
  long lVar13;
  uchar yy;
  coord new_xy;
  int montype;
  coord xy;
  uchar local_40;
  char local_3f;
  coord local_3e;
  int local_3c;
  int local_38;
  coord local_32;
  
  if (obj->otyp != 0x10e) {
    return (monst *)0x0;
  }
  local_3c = obj->corpsenm;
  lVar13 = (long)local_3c;
  if (obj->where == '\x02') {
    pmVar7 = (obj->v).v_ocarry;
    if (pmVar7 == (monst *)0x0) {
      return (monst *)0x0;
    }
    uVar12 = 0;
    pmVar9 = pmVar7;
    while (cVar10 = pmVar9->mtrack[2].x, cVar10 == '\x02') {
      uVar12 = uVar12 + 1;
      pmVar9 = (monst *)pmVar9->data;
      if (pmVar9 == (monst *)0x0) {
        return (monst *)0x0;
      }
    }
    if (cVar10 == '\x01') {
      bVar4 = get_obj_location(obj,&local_3f,(xchar *)&local_40,1);
      if (bVar4 == '\0') {
        return (monst *)0x0;
      }
    }
    else if (cVar10 == '\x03') {
      local_3f = u.ux;
      local_40 = u.uy;
    }
    else {
      if (cVar10 != '\x04') {
        return (monst *)0x0;
      }
      local_3f = *(char *)((long)&pmVar9->data[1].geno + 1);
      local_40 = pmVar9->data[1].mattk[0].aatyp;
    }
    cVar10 = local_3f;
    yy = local_40;
    if (local_40 == '\0' || local_3f == '\0') {
      return (monst *)0x0;
    }
    if (2 < uVar12 || (pmVar7->mtrack[3].y & 0x20U) != 0) {
      return (monst *)0x0;
    }
    sVar2 = *(short *)((long)&pmVar7->m_id + 2);
    if (sVar2 == 0x215) {
      return (monst *)0x0;
    }
    if ((sVar2 == 0xe0) &&
       (uVar12 = mt_random(), 0x6666666 < (uVar12 * -0x33333333 >> 3 | uVar12 * -0x60000000))) {
      return (monst *)0x0;
    }
  }
  else {
    bVar4 = get_obj_location(obj,&local_3f,(xchar *)&local_40,0);
    cVar10 = local_3f;
    yy = local_40;
    if (bVar4 == '\0') {
      return (monst *)0x0;
    }
  }
  pmVar7 = level->monsters[cVar10][(char)yy];
  if (((pmVar7 != (monst *)0x0) && ((pmVar7->field_0x61 & 2) == 0)) &&
     (bVar4 = enexto(&local_3e,level,cVar10,yy,mons + lVar13), bVar4 != '\0')) {
    local_3f = local_3e.x;
    local_40 = local_3e.y;
    cVar10 = local_3e.x;
    yy = local_3e.y;
  }
  bVar4 = cant_create(&local_3c,'\x01');
  if (bVar4 != '\0') {
    pmVar7 = makemon(mons + local_3c,level,(int)cVar10,(int)(char)yy,3);
    if (pmVar7 == (monst *)0x0) {
      return (monst *)0x0;
    }
    pmVar7->mhp = 100;
    pmVar7->mhpmax = 100;
    bVar3 = false;
    mon_adjust_speed(pmVar7,2,(obj *)0x0);
    sVar11 = '\0';
    goto LAB_0029192a;
  }
  if ((obj->oxlth == 0) || ((*(uint *)&obj->field_0x4a & 0x600000) != 0x200000)) {
    pmVar7 = makemon(mons + local_3c,level,(int)cVar10,(int)(char)yy,0x43);
  }
  else {
    local_32.x = cVar10;
    local_32.y = yy;
    pmVar7 = montraits(obj,&local_32);
    if (((pmVar7 != (monst *)0x0) && (pmVar7->mtame != '\0')) && ((pmVar7->field_0x63 & 4) == 0)) {
      wary_dog(pmVar7,'\x01');
    }
  }
  if (pmVar7 == (monst *)0x0) {
    return (monst *)0x0;
  }
  if ((obj->oxlth == 0) || ((*(uint *)&obj->field_0x4a & 0x600000) != 0x400000)) {
    bVar3 = false;
    sVar11 = '\0';
  }
  else {
    pmVar9 = find_mid(level,obj->oextra[0],1);
    if ((pmVar9 == (monst *)0x0) || (pmVar9->data != mons + 0x12a)) {
      bVar3 = false;
      sVar11 = '\0';
    }
    else {
      cVar10 = pmVar9->mx;
      local_38 = (int)pmVar9->my;
      sVar11 = pmVar9->mtame;
      if (pmVar9->wormno == '\0') {
        bVar5 = viz_array[local_38][(int)cVar10] & 2;
      }
      else {
        bVar5 = worm_known(level,pmVar9);
      }
      if (bVar5 != 0) {
        uVar12 = *(uint *)&pmVar9->field_0x60;
        if ((((uVar12 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) {
          if ((uVar12 & 0x280) == 0) goto LAB_002918ab;
        }
        else if (((uVar12 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_002918ab:
          if ((u._1052_1_ & 0x20) == 0) {
            pcVar8 = Monnam(pmVar9);
            pline("%s is suddenly drawn into its former body!",pcVar8);
          }
        }
      }
      mondead(pmVar9);
      newsym((int)cVar10,local_38);
      bVar3 = true;
    }
    obj->field_0x4c = obj->field_0x4c & 0x9f;
  }
  if (obj->onamelth != '\0') {
    pmVar7 = christen_monst(pmVar7,(char *)((long)obj->oextra + (long)obj->oxlth));
  }
  if ((pmVar7->data->msound == '\x1f') || (pmVar7->m_id == quest_status.leader_m_id)) {
    quest_status._2_1_ = quest_status._2_1_ & 0xef;
  }
LAB_0029192a:
  if (obj->oeaten != 0) {
    iVar6 = eaten_stat(pmVar7->mhp,obj);
    pmVar7->mhp = iVar6;
  }
  pmVar7->field_0x61 = pmVar7->field_0x61 | 0x40;
  if (bVar3) {
    if ((sVar11 != '\0') && (pmVar9 = tamedog(pmVar7,(obj *)0x0), pmVar9 != (monst *)0x0)) {
      pmVar9->mtame = sVar11;
      pmVar7 = pmVar9;
    }
    pmVar7->field_0x62 = pmVar7->field_0x62 | 0x20;
  }
  switch(obj->where) {
  case '\x01':
    break;
  case '\x02':
    obj_extract_self(obj);
    obfree(obj,(obj *)0x0);
    return pmVar7;
  case '\x03':
    useup(obj);
    return pmVar7;
  case '\x04':
    m_useup((obj->v).v_ocarry,obj);
    return pmVar7;
  default:
    panic("revive");
  }
  cVar10 = obj->ox;
  cVar1 = obj->oy;
  if (1 < obj->quan) {
    obj = splitobj(obj,1);
  }
  delobj(obj);
  newsym((int)cVar10,(int)cVar1);
  return pmVar7;
}

Assistant:

struct monst *revive(struct obj *obj)
{
	struct monst *mtmp = NULL;
	struct obj *container = NULL;
	int container_nesting = 0;
	schar savetame = 0;
	boolean recorporealization = FALSE;
	boolean in_container = FALSE;
	if (obj->otyp == CORPSE) {
		int montype = obj->corpsenm;
		xchar x, y;

		if (obj->where == OBJ_CONTAINED) {
			/* deal with corpses in [possibly nested] containers */
			struct monst *carrier;
			int holder = 0;

			container = obj->ocontainer;
			carrier = get_container_location(container, &holder,
							&container_nesting);
			switch(holder) {
			    case OBJ_MINVENT:
				x = carrier->mx; y = carrier->my;
				in_container = TRUE;
				break;
			    case OBJ_INVENT:
				x = u.ux; y = u.uy;
				in_container = TRUE;
				break;
			    case OBJ_FLOOR:
				if (!get_obj_location(obj, &x, &y, CONTAINED_TOO))
					return NULL;
				in_container = TRUE;
				break;
			    default:
			    	return NULL;
			}
		} else {
			/* only for invent, minvent, or floor */
			if (!get_obj_location(obj, &x, &y, 0))
			    return NULL;
		}
		if (in_container) {
			/* Rules for revival from containers:
			   - the container cannot be locked
			   - the container cannot be heavily nested (>2 is arbitrary)
			   - the container cannot be a statue or bag of holding
			     (except in very rare cases for the latter)
			 */
			if (!x || !y || container->olocked || container_nesting > 2 ||
			    container->otyp == STATUE ||
			    (container->otyp == BAG_OF_HOLDING && rn2(40)))
				return NULL;
		}

		if (MON_AT(level, x,y)) {
		    coord new_xy;

		    if (enexto(&new_xy, level, x, y, &mons[montype]))
			x = new_xy.x,  y = new_xy.y;
		}

		if (cant_create(&montype, TRUE)) {
			/* make a zombie or worm instead */
			mtmp = makemon(&mons[montype], level, x, y,
				       NO_MINVENT|MM_NOWAIT);
			if (mtmp) {
				mtmp->mhp = mtmp->mhpmax = 100;
				mon_adjust_speed(mtmp, 2, NULL); /* MFAST */
			}
		} else {
		    if (obj->oxlth && (obj->oattached == OATTACHED_MONST)) {
			    coord xy;
			    xy.x = x; xy.y = y;
			    mtmp = montraits(obj, &xy);
			    if (mtmp && mtmp->mtame && !mtmp->isminion)
				wary_dog(mtmp, TRUE);
		    } else
			    mtmp = makemon(&mons[montype], level, x, y,
				    NO_MINVENT|MM_NOWAIT|MM_NOCOUNTBIRTH);
		    if (mtmp) {
			if (obj->oxlth && (obj->oattached == OATTACHED_M_ID)) {
			    unsigned m_id;
			    struct monst *ghost;
			    memcpy(&m_id, obj->oextra, sizeof(m_id));
			    ghost = find_mid(level, m_id, FM_FMON);
			    if (ghost && ghost->data == &mons[PM_GHOST]) {
				    int x2, y2;
				    x2 = ghost->mx; y2 = ghost->my;
				    if (ghost->mtame)
					savetame = ghost->mtame;
				    if (canseemon(level, ghost))
					pline("%s is suddenly drawn into its former body!",
						Monnam(ghost));
				    mondead(ghost);
				    recorporealization = TRUE;
				    newsym(x2, y2);
			    }
			    /* don't mess with obj->oxlth here */
			    obj->oattached = OATTACHED_NOTHING;
			}
			/* Monster retains its name */
			if (obj->onamelth)
			    mtmp = christen_monst(mtmp, ONAME(obj));
			/* flag the quest leader as alive. */
			if (mtmp->data->msound == MS_LEADER || mtmp->m_id ==
				quest_status.leader_m_id)
			    quest_status.leader_is_dead = FALSE;
		    }
		}
		if (mtmp) {
			if (obj->oeaten)
				mtmp->mhp = eaten_stat(mtmp->mhp, obj);
			/* track that this monster was revived at least once */
			mtmp->mrevived = 1;

			if (recorporealization) {
				/* If mtmp is revivification of former tame ghost*/
				if (savetame) {
				    struct monst *mtmp2 = tamedog(mtmp, NULL);
				    if (mtmp2) {
					mtmp2->mtame = savetame;
					mtmp = mtmp2;
				    }
				}
				/* was ghost, now alive, it's all very confusing */
				mtmp->mconf = 1;
			}

			switch (obj->where) {
			    case OBJ_INVENT:
				useup(obj);
				break;
			    case OBJ_FLOOR:
				/* in case MON_AT+enexto for invisible mon */
				x = obj->ox,  y = obj->oy;
				/* not useupf(), which charges */
				if (obj->quan > 1L)
				    obj = splitobj(obj, 1L);
				delobj(obj);
				newsym(x, y);
				break;
			    case OBJ_MINVENT:
				m_useup(obj->ocarry, obj);
				break;
			    case OBJ_CONTAINED:
				obj_extract_self(obj);
				obfree(obj, NULL);
				break;
			    default:
				panic("revive");
			}
		}
	}
	return mtmp;
}